

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseFuncflFile
          (EAMAtomTypesSectionParser *this,ForceField *ff,EAMAdapter ea,string *funcflFile,
          int param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  RealType RVar3;
  RealType RVar4;
  char cVar5;
  int iVar6;
  int num;
  ifstrstream *input;
  long *plVar7;
  size_t sVar8;
  pointer pdVar9;
  ifstrstream *piVar10;
  vector<double,_std::allocator<double>_> F;
  vector<double,_std::allocator<double>_> rho;
  vector<double,_std::allocator<double>_> Z;
  StringTokenizer tokenizer1;
  string lattice;
  char buffer [65535];
  RealType RStack_101d8;
  RealType RStack_101d0;
  RealType RStack_101c8;
  string sStack_101c0;
  RealType RStack_101a0;
  string sStack_10198;
  vector<double,_std::allocator<double>_> vStack_10178;
  vector<double,_std::allocator<double>_> vStack_10158;
  vector<double,_std::allocator<double>_> vStack_10138;
  undefined1 auStack_10120 [32];
  _Alloc_hider _Stack_10100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_100f0 [2];
  vector<double,_std::allocator<double>_> vStack_100c8;
  vector<double,_std::allocator<double>_> vStack_100b0;
  undefined1 *puStack_10098;
  long lStack_10090;
  undefined1 uStack_10088;
  undefined7 uStack_10087;
  EAMAdapter EStack_10078;
  string sStack_10070;
  vector<double,_std::allocator<double>_> vStack_10050;
  char acStack_10038 [65544];
  
  EStack_10078.at_ = ea.at_;
  input = ForceField::openForceFieldFile(ff,funcflFile);
  cVar5 = (char)input;
  std::ios::widen((char)(input->super_basic_istream<char,_std::char_traits<char>_>).
                        _vptr_basic_istream[-3] + cVar5);
  std::istream::getline((char *)input,(long)acStack_10038,-1);
  lStack_10090 = 0;
  uStack_10088 = 0;
  vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_10158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_10158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_10158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  puStack_10098 = &uStack_10088;
  std::ios::widen((char)(input->super_basic_istream<char,_std::char_traits<char>_>).
                        _vptr_basic_istream[-3] + cVar5);
  plVar7 = (long *)std::istream::getline((char *)input,(long)acStack_10038,-1);
  RStack_101c8 = 0.0;
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
    paVar1 = &sStack_101c0.field_2;
    sStack_101c0._M_dataplus._M_p = (pointer)paVar1;
    sVar8 = strlen(acStack_10038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sStack_101c0,acStack_10038,acStack_10038 + sVar8);
    sStack_10198._M_dataplus._M_p = (pointer)&sStack_10198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10198," ;\t\n\r","");
    StringTokenizer::StringTokenizer((StringTokenizer *)auStack_10120,&sStack_101c0,&sStack_10198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_10198._M_dataplus._M_p != &sStack_10198.field_2) {
      operator_delete(sStack_10198._M_dataplus._M_p,sStack_10198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_101c0._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_101c0._M_dataplus._M_p,sStack_101c0.field_2._M_allocated_capacity + 1);
    }
    iVar6 = StringTokenizer::countTokens((StringTokenizer *)auStack_10120);
    if (iVar6 < 4) {
      builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",0x34);
      painCave.isFatal = 1;
      RStack_101c8 = 0.0;
      simError();
    }
    else {
      StringTokenizer::nextTokenAsInt((StringTokenizer *)auStack_10120);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10120);
      RVar3 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10120);
      RStack_101c8 = this->dus_;
      StringTokenizer::nextToken_abi_cxx11_(&sStack_101c0,(StringTokenizer *)auStack_10120);
      std::__cxx11::string::operator=((string *)&puStack_10098,(string *)&sStack_101c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_101c0._M_dataplus._M_p != paVar1) {
        operator_delete(sStack_101c0._M_dataplus._M_p,sStack_101c0.field_2._M_allocated_capacity + 1
                       );
      }
      RStack_101c8 = RVar3 * RStack_101c8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_10100._M_p != aaStack_100f0) {
      operator_delete(_Stack_10100._M_p,aaStack_100f0[0]._M_allocated_capacity + 1);
    }
    if ((ifstrstream *)auStack_10120._0_8_ != (ifstrstream *)(auStack_10120 + 0x10)) {
      operator_delete((void *)auStack_10120._0_8_,auStack_10120._16_8_ + 1);
    }
  }
  std::ios::widen((char)(input->super_basic_istream<char,_std::char_traits<char>_>).
                        _vptr_basic_istream[-3] + cVar5);
  piVar10 = input;
  plVar7 = (long *)std::istream::getline((char *)input,(long)acStack_10038,-1);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
    sStack_101c0._M_dataplus._M_p = (pointer)&sStack_101c0.field_2;
    sVar8 = strlen(acStack_10038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sStack_101c0,acStack_10038,acStack_10038 + sVar8);
    sStack_10198._M_dataplus._M_p = (pointer)&sStack_10198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10198," ;\t\n\r","");
    StringTokenizer::StringTokenizer((StringTokenizer *)auStack_10120,&sStack_101c0,&sStack_10198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_10198._M_dataplus._M_p != &sStack_10198.field_2) {
      operator_delete(sStack_10198._M_dataplus._M_p,sStack_10198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_101c0._M_dataplus._M_p != &sStack_101c0.field_2) {
      operator_delete(sStack_101c0._M_dataplus._M_p,sStack_101c0.field_2._M_allocated_capacity + 1);
    }
    iVar6 = StringTokenizer::countTokens((StringTokenizer *)auStack_10120);
    if (iVar6 < 5) {
      builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",0x34);
      painCave.isFatal = 1;
      simError();
      num = 0;
      RStack_101d8 = 0.0;
      RStack_101d0 = 0.0;
      RStack_101a0 = 0.0;
      iVar6 = 0;
    }
    else {
      iVar6 = StringTokenizer::nextTokenAsInt((StringTokenizer *)auStack_10120);
      RStack_101a0 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10120);
      num = StringTokenizer::nextTokenAsInt((StringTokenizer *)auStack_10120);
      RVar3 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10120);
      RStack_101d8 = this->dus_;
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_10120);
      RStack_101d8 = RVar3 * RStack_101d8;
      RStack_101d0 = RVar4 * this->dus_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_10100._M_p != aaStack_100f0) {
      operator_delete(_Stack_10100._M_p,aaStack_100f0[0]._M_allocated_capacity + 1);
    }
    if ((ifstrstream *)auStack_10120._0_8_ != (ifstrstream *)(auStack_10120 + 0x10)) {
      operator_delete((void *)auStack_10120._0_8_,auStack_10120._16_8_ + 1);
    }
  }
  else {
    num = 0;
    RStack_101d8 = 0.0;
    RStack_101d0 = 0.0;
    RStack_101a0 = 0.0;
    iVar6 = 0;
    auStack_10120._0_8_ = piVar10;
  }
  parseEAMArray((EAMAtomTypesSectionParser *)auStack_10120._0_8_,
                &input->super_basic_istream<char,_std::char_traits<char>_>,&vStack_10178,iVar6);
  parseEAMArray((EAMAtomTypesSectionParser *)auStack_10120._0_8_,
                &input->super_basic_istream<char,_std::char_traits<char>_>,&vStack_10138,num);
  parseEAMArray((EAMAtomTypesSectionParser *)auStack_10120._0_8_,
                &input->super_basic_istream<char,_std::char_traits<char>_>,&vStack_10158,num);
  if (vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    dVar2 = this->eus_;
    pdVar9 = vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pdVar9 = *pdVar9 * dVar2;
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 != vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  sStack_10070._M_dataplus._M_p = (pointer)&sStack_10070.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_10070,puStack_10098,puStack_10098 + lStack_10090);
  std::vector<double,_std::allocator<double>_>::vector(&vStack_100b0,&vStack_10138);
  std::vector<double,_std::allocator<double>_>::vector(&vStack_100c8,&vStack_10158);
  std::vector<double,_std::allocator<double>_>::vector(&vStack_10050,&vStack_10178);
  EAMAdapter::makeFuncfl
            (&EStack_10078,RStack_101c8,&sStack_10070,iVar6,RStack_101a0,num,RStack_101d8,
             RStack_101d0,&vStack_100b0,&vStack_100c8,&vStack_10050);
  if (vStack_10050.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_10050.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_10050.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10050.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vStack_100c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_100c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_100c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_100c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vStack_100b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_100b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_100b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_100b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10070._M_dataplus._M_p != &sStack_10070.field_2) {
    operator_delete(sStack_10070._M_dataplus._M_p,sStack_10070.field_2._M_allocated_capacity + 1);
  }
  (*(input->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])(input);
  if (vStack_10158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_10158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_10158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (puStack_10098 != &uStack_10088) {
    operator_delete(puStack_10098,CONCAT71(uStack_10087,uStack_10088) + 1);
  }
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseFuncflFile(ForceField& ff, EAMAdapter ea,
                                                  const string& funcflFile,
                                                  int) {
    ifstrstream* ppfStream = ff.openForceFieldFile(funcflFile);
    const int bufferSize   = 65535;
    char buffer[bufferSize];

    // skip first line
    ppfStream->getline(buffer, bufferSize);

    // The second line contains atomic number, atomic mass, a lattice
    // constant and lattice type
    int atomicNumber;
    RealType atomicMass;
    RealType latticeConstant(0.0);
    std::string lattice;

    // The third line is nrho, drho, nr, dr and rcut
    int nrho(0);
    RealType drho(0.0);
    int nr(0);
    RealType dr(0.0);
    RealType rcut(0.0);
    std::vector<RealType> F;
    std::vector<RealType> Z;
    std::vector<RealType> rho;

    if (ppfStream->getline(buffer, bufferSize)) {
      StringTokenizer tokenizer1(buffer);

      if (tokenizer1.countTokens() >= 4) {
        atomicNumber    = tokenizer1.nextTokenAsInt();
        atomicMass      = tokenizer1.nextTokenAsDouble();
        latticeConstant = tokenizer1.nextTokenAsDouble() * dus_;
        lattice         = tokenizer1.nextToken();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    FIX_UNUSED(atomicNumber);
    FIX_UNUSED(atomicMass);

    if (ppfStream->getline(buffer, bufferSize)) {
      StringTokenizer tokenizer2(buffer);

      if (tokenizer2.countTokens() >= 5) {
        nrho = tokenizer2.nextTokenAsInt();
        drho = tokenizer2.nextTokenAsDouble();
        nr   = tokenizer2.nextTokenAsInt();
        dr   = tokenizer2.nextTokenAsDouble() * dus_;
        rcut = tokenizer2.nextTokenAsDouble() * dus_;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    parseEAMArray(*ppfStream, F, nrho);
    parseEAMArray(*ppfStream, Z, nr);
    parseEAMArray(*ppfStream, rho, nr);

    // Convert to kcal/mol using energy unit scaling in force field:
    std::transform(
        F.begin(), F.end(), F.begin(),
        std::bind(std::multiplies<RealType>(), eus_, std::placeholders::_1));

    ea.makeFuncfl(latticeConstant, lattice, nrho, drho, nr, dr, rcut, Z, rho,
                  F);

    delete ppfStream;
  }